

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall MockHttpClient::MockHttpClient(MockHttpClient *this,Config *config)

{
  Config CVar1;
  undefined1 in_stack_ffffffffffffff38 [48];
  _Alloc_hider in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  _Alloc_hider in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  _Alloc_hider in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  path in_stack_ffffffffffffffc0;
  
  Vault::Config::Config((Config *)&stack0xffffffffffffff40,config);
  CVar1.host_.value_._M_string_length = (size_type)in_stack_ffffffffffffff68._M_p;
  CVar1.tls_ = (bool)in_stack_ffffffffffffff38[0];
  CVar1.debug_ = (bool)in_stack_ffffffffffffff38[1];
  CVar1.verify_ = (bool)in_stack_ffffffffffffff38[2];
  CVar1._3_5_ = in_stack_ffffffffffffff38._3_5_;
  CVar1.connectTimeout_.value_ = in_stack_ffffffffffffff38._8_8_;
  CVar1.requestTimeout_.value_ = in_stack_ffffffffffffff38._16_8_;
  CVar1.lowSpeedTimeout_.value_ = in_stack_ffffffffffffff38._24_8_;
  CVar1.lowSpeedLimit_.value_ = in_stack_ffffffffffffff38._32_8_;
  CVar1.host_.value_._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38._40_8_;
  CVar1.host_.value_.field_2._M_allocated_capacity = in_stack_ffffffffffffff70;
  CVar1.host_.value_.field_2._8_8_ = in_stack_ffffffffffffff78;
  CVar1.port_.value_._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff80;
  CVar1.port_.value_._M_string_length = (size_type)in_stack_ffffffffffffff88._M_p;
  CVar1.port_.value_.field_2._M_allocated_capacity = in_stack_ffffffffffffff90;
  CVar1.port_.value_.field_2._8_8_ = in_stack_ffffffffffffff98;
  CVar1.ns_.value_._M_dataplus._M_p = (pointer)in_stack_ffffffffffffffa0;
  CVar1.ns_.value_._M_string_length = (size_type)in_stack_ffffffffffffffa8._M_p;
  CVar1.ns_.value_.field_2._M_allocated_capacity = in_stack_ffffffffffffffb0;
  CVar1.ns_.value_.field_2._8_8_ = in_stack_ffffffffffffffb8;
  CVar1.caBundle_ = in_stack_ffffffffffffffc0;
  Vault::HttpClient::HttpClient(&this->super_HttpClient,CVar1);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffc8);
  if (in_stack_ffffffffffffffa8._M_p != &stack0xffffffffffffffb8) {
    operator_delete(in_stack_ffffffffffffffa8._M_p,in_stack_ffffffffffffffb8 + 1);
  }
  if (in_stack_ffffffffffffff88._M_p != &stack0xffffffffffffff98) {
    operator_delete(in_stack_ffffffffffffff88._M_p,in_stack_ffffffffffffff98 + 1);
  }
  if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
    operator_delete(in_stack_ffffffffffffff68._M_p,in_stack_ffffffffffffff78 + 1);
  }
  *(undefined ***)this = &PTR__MockHttpClient_00194f20;
  (this->response_).super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
  super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::HttpResponse>._M_engaged = false;
  return;
}

Assistant:

explicit MockHttpClient(Vault::Config &config) : HttpClient(config) {}